

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::IfcRoof(IfcRoof *this)

{
  IfcRoof *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcRoof");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00ffc610);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>,
             &PTR_construction_vtable_24__00ffc748);
  *(undefined8 *)this = 0xffc4e0;
  *(undefined8 *)&this->field_0x178 = 0xffc5f8;
  *(undefined8 *)&this->field_0x88 = 0xffc508;
  *(undefined8 *)&this->field_0x98 = 0xffc530;
  *(undefined8 *)&this->field_0xd0 = 0xffc558;
  *(undefined8 *)&this->field_0x100 = 0xffc580;
  *(undefined8 *)&this->field_0x138 = 0xffc5a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xffc5d0;
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}